

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

int Cnf_CountCnfSize(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *vSuper;
  Vec_Ptr_t *vNodes_00;
  Vec_Int_t *vCover_00;
  void *pvVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar3;
  int local_3c;
  int nSize;
  int i;
  int nClauses;
  int nVars;
  Aig_Obj_t *pObj;
  Vec_Int_t *vCover;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLeaves;
  Aig_Man_t *p_local;
  
  i = 0;
  nSize = 0;
  vSuper = Vec_PtrAlloc(100);
  vNodes_00 = Vec_PtrAlloc(100);
  vCover_00 = Vec_IntAlloc(0x10000);
  for (local_3c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,local_3c);
    if (pvVar2 != (void *)0x0) {
      i = ((uint)(*(ulong *)((long)pvVar2 + 0x18) >> 4) & 1) + i;
    }
  }
  local_3c = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_3c) {
      printf("Vars = %d  Clauses = %d\n",(ulong)(uint)i,(ulong)(uint)nSize);
      Vec_PtrFree(vSuper);
      Vec_PtrFree(vNodes_00);
      Vec_IntFree(vCover_00);
      return nSize;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_3c);
    if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
       ((*(ulong *)&pObj_00->field_0x18 >> 4 & 1) != 0)) {
      Cnf_CollectLeaves(pObj_00,vSuper,0);
      Cnf_CollectVolume(p,pObj_00,vSuper,vNodes_00);
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntryLast(vNodes_00);
      if (pObj_00 != pAVar3) {
        __assert_fail("pObj == Vec_PtrEntryLast(vNodes)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                      ,0x205,"int Cnf_CountCnfSize(Aig_Man_t *)");
      }
      iVar1 = Cnf_CutCountClauses(p,vSuper,vNodes_00,vCover_00);
      nSize = iVar1 + nSize;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int Cnf_CountCnfSize( Aig_Man_t * p )
{
    Vec_Ptr_t * vLeaves, * vNodes;
    Vec_Int_t * vCover;
    Aig_Obj_t * pObj;
    int nVars = 0, nClauses = 0;
    int i, nSize;

    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vCover  = Vec_IntAlloc( 1 << 16 );

    Aig_ManForEachObj( p, pObj, i )
        nVars += pObj->fMarkA;

    Aig_ManForEachNode( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        Cnf_CollectLeaves( pObj, vLeaves, 0 );
        Cnf_CollectVolume( p, pObj, vLeaves, vNodes );
        assert( pObj == Vec_PtrEntryLast(vNodes) );

        nSize = Cnf_CutCountClauses( p, vLeaves, vNodes, vCover );
//        printf( "%d(%d) ", Vec_PtrSize(vLeaves), nSize );

        nClauses += nSize;
    }
//    printf( "\n" );
    printf( "Vars = %d  Clauses = %d\n", nVars, nClauses );

    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vCover );
    return nClauses;
}